

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O1

void __thiscall TPZMHMeshControl::TPZMHMeshControl(TPZMHMeshControl *this,TPZMHMeshControl *copy)

{
  _Rb_tree_header *p_Var1;
  TPZReference *pTVar2;
  TPZReference *pTVar3;
  
  this->_vptr_TPZMHMeshControl = (_func_int **)&PTR__TPZMHMeshControl_01a08528;
  pTVar2 = (TPZReference *)operator_new(0x10);
  pTVar2->fPointer = (TPZGeoMesh *)0x0;
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar2->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fGMesh).fRef = pTVar2;
  pTVar3 = (TPZReference *)operator_new(0x10);
  pTVar3->fPointer = (TPZCompMesh *)0x0;
  (pTVar3->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar3->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fCMesh).fRef = pTVar3;
  pTVar3 = (TPZReference *)operator_new(0x10);
  pTVar3->fPointer = (TPZCompMesh *)0x0;
  (pTVar3->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar3->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fCMeshLagrange).fRef = pTVar3;
  pTVar3 = (TPZReference *)operator_new(0x10);
  pTVar3->fPointer = (TPZCompMesh *)0x0;
  (pTVar3->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar3->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fCMeshConstantPressure).fRef = pTVar3;
  pTVar3 = (TPZReference *)operator_new(0x10);
  pTVar3->fPointer = (TPZCompMesh *)0x0;
  (pTVar3->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar3->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fPressureFineMesh).fRef = pTVar3;
  this->fProblemType = EScalar;
  this->fNState = 1;
  this->fSkeletonMatId = 4;
  this->fSecondSkeletonMatId = 3;
  this->fPressureSkeletonMatId = 6;
  this->fLagrangeMatIdLeft = 0x226;
  this->fLagrangeMatIdRight = 0x227;
  p_Var1 = &(this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->fMaterialIds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->fMaterialBCIds)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->fpOrderInternal = 1;
  this->fpOrderSkeleton = 1;
  this->fHdivmaismais = 0;
  this->fSkeletonWrapMatId = 500;
  this->fBoundaryWrapMatId = 0x1f6;
  this->fInternalWrapMatId = 0x1f5;
  TPZManVector<long,_10>::TPZManVector(&this->fGeoToMHMDomain,0);
  p_Var1 = &(this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header;
  (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->fInterfaces)._M_t._M_impl.super__Rb_tree_header;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->fInterfaces)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  *(undefined4 *)
   ((long)&(this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_node_count +
   7) = 0;
  (this->fConnectToSubDomainIdentifier)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  operator=(this,copy);
  return;
}

Assistant:

TPZMHMeshControl::TPZMHMeshControl(const TPZMHMeshControl &copy){

    this->operator=(copy);
}